

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.h
# Opt level: O2

void bcf_enc_size(kstring_t *s,int size,int type)

{
  int l;
  int32_t *p;
  int16_t x_1;
  int32_t x;
  
  if (size < 0xf) {
    size = size << 4 | type;
  }
  else {
    kputc(type | 0xf0,s);
    if (0x7f < (uint)size) {
      if ((uint)size < 0x8000) {
        p = (int32_t *)&x_1;
        x_1 = (int16_t)size;
        kputc(0x12,s);
        l = 2;
      }
      else {
        p = &x;
        x = size;
        kputc(0x13,s);
        l = 4;
      }
      kputsn((char *)p,l,s);
      return;
    }
    kputc(0x11,s);
  }
  kputc(size,s);
  return;
}

Assistant:

static inline void bcf_enc_size(kstring_t *s, int size, int type)
{
    if (size >= 15) {
        kputc(15<<4|type, s);
        if (size >= 128) {
            if (size >= 32768) {
                int32_t x = size;
                kputc(1<<4|BCF_BT_INT32, s);
                kputsn((char*)&x, 4, s);
            } else {
                int16_t x = size;
                kputc(1<<4|BCF_BT_INT16, s);
                kputsn((char*)&x, 2, s);
            }
        } else {
            kputc(1<<4|BCF_BT_INT8, s);
            kputc(size, s);
        }
    } else kputc(size<<4|type, s);
}